

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall
re2::Compiler::CachedRuneByteSuffix(Compiler *this,uint8 lo,uint8 hi,bool foldcase,int next)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  uint64 key;
  ulong local_18;
  
  local_18 = CONCAT71(in_register_00000009,foldcase) & 0xffffffff |
             ((ulong)(uint)((int)CONCAT71(in_register_00000031,lo) << 9) | (long)next << 0x11) +
             (CONCAT71(in_register_00000011,hi) & 0xffffffff) * 2;
  p_Var1 = &(this->rune_cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->rune_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < local_18]) {
    if (*(ulong *)(p_Var5 + 1) >= local_18) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, local_18 < *(ulong *)(p_Var4 + 1)))
  {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    iVar2 = UncachedRuneByteSuffix(this,lo,hi,foldcase,next);
    pmVar3 = std::
             map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::operator[](&this->rune_cache_,&local_18);
    *pmVar3 = iVar2;
  }
  else {
    iVar2 = *(int *)&p_Var5[1]._M_parent;
  }
  return iVar2;
}

Assistant:

static uint64 MakeRuneCacheKey(uint8 lo, uint8 hi, bool foldcase, int next) {
  return (uint64)next << 17 |
         (uint64)lo   <<  9 |
         (uint64)hi   <<  1 |
         (uint64)foldcase;
}